

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentSampledImage::~RenderFragmentSampledImage
          (RenderFragmentSampledImage *this)

{
  ~RenderFragmentSampledImage(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

RenderFragmentSampledImage::~RenderFragmentSampledImage (void)
{
}